

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O1

void xmlNanoHTTPCleanup(void)

{
  if (proxy != (char *)0x0) {
    (*xmlFree)(proxy);
    proxy = (char *)0x0;
  }
  initialized = 0;
  return;
}

Assistant:

void
xmlNanoHTTPCleanup(void) {
    if (proxy != NULL) {
	xmlFree(proxy);
	proxy = NULL;
    }
#ifdef _WINSOCKAPI_
    if (initialized)
	WSACleanup();
#endif
    initialized = 0;
    return;
}